

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_read_compressed_img_plane
              (fitsfile *fptr,int datatype,int bytesperpixel,long nplane,LONGLONG *firstcoord,
              LONGLONG *lastcoord,long *inc,long *naxes,int nullcheck,void *nullval,void *array,
              char *nullarray,int *anynul,long *nread,int *status)

{
  long lVar1;
  long *in_R8;
  long *in_R9;
  long *in_stack_00000010;
  int tnull;
  char *nullarrayptr;
  char *arrayptr;
  LONGLONG trc [6];
  LONGLONG blc [6];
  int in_stack_00000264;
  long *in_stack_00000268;
  LONGLONG *in_stack_00000270;
  LONGLONG *in_stack_00000278;
  int in_stack_00000284;
  fitsfile *in_stack_00000288;
  void *in_stack_000002c0;
  void *in_stack_000002c8;
  char *in_stack_000002d0;
  int *in_stack_000002d8;
  int *in_stack_000002e0;
  int local_bc;
  long local_a8;
  long local_a0;
  int local_14;
  
  if (arrayptr != (char *)0x0) {
    arrayptr[0] = '\0';
    arrayptr[1] = '\0';
    arrayptr[2] = '\0';
    arrayptr[3] = '\0';
  }
  *(undefined8 *)trc[0] = 0;
  if (*in_R8 != 0) {
    lVar1 = *in_R8;
    if (in_R9[1] == in_R8[1]) {
      local_a8 = *in_R9 + 1;
    }
    else {
      local_a8 = *in_stack_00000010;
    }
    fits_read_compressed_img
              (in_stack_00000288,in_stack_00000284,in_stack_00000278,in_stack_00000270,
               in_stack_00000268,in_stack_00000264,in_stack_000002c0,in_stack_000002c8,
               in_stack_000002d0,in_stack_000002d8,in_stack_000002e0);
    *(long *)trc[0] = *(long *)trc[0] + (local_a8 - (lVar1 + 1)) + 1;
    if ((local_bc != 0) && (arrayptr != (char *)0x0)) {
      arrayptr[0] = '\x01';
      arrayptr[1] = '\0';
      arrayptr[2] = '\0';
      arrayptr[3] = '\0';
    }
    if (in_R9[1] == in_R8[1]) {
      return *(int *)trc[1];
    }
    *in_R8 = 0;
    in_R8[1] = in_R8[1] + 1;
  }
  lVar1 = in_R8[1];
  if (*in_R9 + 1 == *in_stack_00000010) {
    local_a0 = in_R9[1] + 1;
  }
  else {
    local_a0 = in_R9[1];
  }
  if (lVar1 + 1 <= local_a0) {
    fits_read_compressed_img
              (in_stack_00000288,in_stack_00000284,in_stack_00000278,in_stack_00000270,
               in_stack_00000268,in_stack_00000264,in_stack_000002c0,in_stack_000002c8,
               in_stack_000002d0,in_stack_000002d8,in_stack_000002e0);
    *(long *)trc[0] = *(long *)trc[0] + ((local_a0 - (lVar1 + 1)) + 1) * *in_stack_00000010;
    if ((local_bc != 0) && (arrayptr != (char *)0x0)) {
      arrayptr[0] = '\x01';
      arrayptr[1] = '\0';
      arrayptr[2] = '\0';
      arrayptr[3] = '\0';
    }
    if (in_R9[1] + 1 == local_a0) {
      return *(int *)trc[1];
    }
  }
  if (local_a0 == in_R9[1] + 1) {
    local_14 = *(int *)trc[1];
  }
  else {
    lVar1 = *in_R9;
    fits_read_compressed_img
              (in_stack_00000288,in_stack_00000284,in_stack_00000278,in_stack_00000270,
               in_stack_00000268,in_stack_00000264,in_stack_000002c0,in_stack_000002c8,
               in_stack_000002d0,in_stack_000002d8,in_stack_000002e0);
    if ((local_bc != 0) && (arrayptr != (char *)0x0)) {
      arrayptr[0] = '\x01';
      arrayptr[1] = '\0';
      arrayptr[2] = '\0';
      arrayptr[3] = '\0';
    }
    *(long *)trc[0] = *(long *)trc[0] + lVar1 + 1;
    local_14 = *(int *)trc[1];
  }
  return local_14;
}

Assistant:

int fits_read_compressed_img_plane(fitsfile *fptr, /* I - FITS file   */
            int  datatype,  /* I - datatype of the array to be returned      */
            int  bytesperpixel, /* I - number of bytes per pixel in array */
            long   nplane,  /* I - which plane of the cube to read      */
            LONGLONG *firstcoord,  /* coordinate of first pixel to read */
            LONGLONG *lastcoord,   /* coordinate of last pixel to read */
            long *inc,         /* increment of pixels to read */
            long *naxes,      /* size of each image dimension */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            long *nread,      /* O - total number of pixels read and returned*/
            int  *status)     /* IO - error status                           */

   /*
           in general we have to read the first partial row of the image,
           followed by the middle complete rows, followed by the last
           partial row of the image.  If the first or last rows are complete,
           then read them at the same time as all the middle rows.
    */
{
     /* bottom left coord. and top right coord. */
    LONGLONG blc[MAX_COMPRESS_DIM], trc[MAX_COMPRESS_DIM]; 
    char *arrayptr, *nullarrayptr;
    int tnull;

    if (anynul)
        *anynul = 0;

    *nread = 0;

    arrayptr = (char *) array;
    nullarrayptr = nullarray;

    blc[2] = nplane + 1;
    trc[2] = nplane + 1;

    if (firstcoord[0] != 0)
    { 
            /* have to read a partial first row */
            blc[0] = firstcoord[0] + 1;
            blc[1] = firstcoord[1] + 1;
            trc[1] = blc[1];  
            if (lastcoord[1] == firstcoord[1])
               trc[0] = lastcoord[0] + 1; /* 1st and last pixels in same row */
            else
               trc[0] = naxes[0];  /* read entire rest of the row */

            fits_read_compressed_img(fptr, datatype, blc, trc, inc,
                nullcheck, nullval, arrayptr, nullarrayptr, &tnull, status);

            *nread = *nread + (long) (trc[0] - blc[0] + 1);

            if (tnull && anynul)
               *anynul = 1;  /* there are null pixels */

            if (lastcoord[1] == firstcoord[1])
            {
               return(*status);  /* finished */
            }

            /* set starting coord to beginning of next line */
            firstcoord[0] = 0;
            firstcoord[1] += 1;
            arrayptr = arrayptr + (trc[0] - blc[0] + 1) * bytesperpixel;
            if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + (trc[0] - blc[0] + 1);

    }

    /* read contiguous complete rows of the image, if any */
    blc[0] = 1;
    blc[1] = firstcoord[1] + 1;
    trc[0] = naxes[0];

    if (lastcoord[0] + 1 == naxes[0])
    {
            /* can read the last complete row, too */
            trc[1] = lastcoord[1] + 1;
    }
    else
    {
            /* last row is incomplete; have to read it separately */
            trc[1] = lastcoord[1];
    }

    if (trc[1] >= blc[1])  /* must have at least one whole line to read */
    {
        fits_read_compressed_img(fptr, datatype, blc, trc, inc,
                nullcheck, nullval, arrayptr, nullarrayptr, &tnull, status);

        *nread = *nread + (long) ((trc[1] - blc[1] + 1) * naxes[0]);

        if (tnull && anynul)
           *anynul = 1;

        if (lastcoord[1] + 1 == trc[1])
               return(*status);  /* finished */

        /* increment pointers for the last partial row */
        arrayptr = arrayptr + (trc[1] - blc[1] + 1) * naxes[0] * bytesperpixel;
        if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + (trc[1] - blc[1] + 1) * naxes[0];
     }

    if (trc[1] == lastcoord[1] + 1)
        return(*status);           /* all done */

    /* set starting and ending coord to last line */

    trc[0] = lastcoord[0] + 1;
    trc[1] = lastcoord[1] + 1;
    blc[1] = trc[1];

    fits_read_compressed_img(fptr, datatype, blc, trc, inc,
                nullcheck, nullval, arrayptr, nullarrayptr, &tnull, status);

    if (tnull && anynul)
       *anynul = 1;

    *nread = *nread + (long) (trc[0] - blc[0] + 1);

    return(*status);
}